

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBSobel(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,int width,
             int height)

{
  int iVar1;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SobelRow;
  uint8_t *in_stack_00000038;
  int in_stack_00000044;
  uint8_t *in_stack_00000048;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *in_stack_00000060;
  
  libyuv::TestCpuFlag(0);
  iVar1 = libyuv::ARGBSobelize
                    (in_stack_00000048,in_stack_00000044,in_stack_00000038,src_argb._4_4_,
                     (int)src_argb,src_stride_argb,in_stack_00000060);
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBSobel(const uint8_t* src_argb,
              int src_stride_argb,
              uint8_t* dst_argb,
              int dst_stride_argb,
              int width,
              int height) {
  void (*SobelRow)(const uint8_t* src_sobelx, const uint8_t* src_sobely,
                   uint8_t* dst_argb, int width) = SobelRow_C;
#if defined(HAS_SOBELROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelRow = SobelRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SobelRow = SobelRow_SSE2;
    }
  }
#endif
#if defined(HAS_SOBELROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelRow = SobelRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      SobelRow = SobelRow_NEON;
    }
  }
#endif
#if defined(HAS_SOBELROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelRow = SobelRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SobelRow = SobelRow_MMI;
    }
  }
#endif
#if defined(HAS_SOBELROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelRow = SobelRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      SobelRow = SobelRow_MSA;
    }
  }
#endif
  return ARGBSobelize(src_argb, src_stride_argb, dst_argb, dst_stride_argb,
                      width, height, SobelRow);
}